

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_string.c
# Opt level: O0

archive_string_conv * get_sconv_object(archive *a,char *fc,char *tc,wchar_t flag)

{
  char *fc_00;
  char *tc_00;
  char *local_58;
  uint local_3c;
  uint current_codepage;
  archive_string_conv *sc;
  wchar_t flag_local;
  char *tc_local;
  char *fc_local;
  archive *a_local;
  
  a_local = (archive *)find_sconv_object(a,fc,tc);
  if (a_local == (archive *)0x0) {
    if (a == (archive *)0x0) {
      local_3c = get_current_codepage();
    }
    else {
      local_3c = a->current_codepage;
    }
    fc_00 = canonical_charset_name(fc);
    tc_00 = canonical_charset_name(tc);
    a_local = (archive *)create_sconv_object(fc_00,tc_00,local_3c,flag);
    if (a_local == (archive *)0x0) {
      if (a != (archive *)0x0) {
        archive_set_error(a,0xc,"Could not allocate memory for a string conversion object");
      }
      a_local = (archive *)0x0;
    }
    else if (*(wchar_t *)&a_local->read_data_block == L'\0') {
      if (a != (archive *)0x0) {
        local_58 = fc;
        if ((flag & 1U) != 0) {
          local_58 = tc;
        }
        archive_set_error(a,-1,"iconv_open failed : Cannot handle ``%s\'\'",local_58);
      }
      free_sconv_object((archive_string_conv *)a_local);
      a_local = (archive *)0x0;
    }
    else if (a != (archive *)0x0) {
      add_sconv_object(a,(archive_string_conv *)a_local);
    }
  }
  return (archive_string_conv *)a_local;
}

Assistant:

static struct archive_string_conv *
get_sconv_object(struct archive *a, const char *fc, const char *tc, int flag)
{
	struct archive_string_conv *sc;
	unsigned current_codepage;

	/* Check if we have made the sconv object. */
	sc = find_sconv_object(a, fc, tc);
	if (sc != NULL)
		return (sc);

	if (a == NULL)
		current_codepage = get_current_codepage();
	else
		current_codepage = a->current_codepage;

	sc = create_sconv_object(canonical_charset_name(fc),
	    canonical_charset_name(tc), current_codepage, flag);
	if (sc == NULL) {
		if (a != NULL)
			archive_set_error(a, ENOMEM,
			    "Could not allocate memory for "
			    "a string conversion object");
		return (NULL);
	}

	/*
	 * If there is no converter for current string conversion object,
	 * we cannot handle this conversion.
	 */
	if (sc->nconverter == 0) {
		if (a != NULL) {
#if HAVE_ICONV
			archive_set_error(a, ARCHIVE_ERRNO_MISC,
			    "iconv_open failed : Cannot handle ``%s''",
			    (flag & SCONV_TO_CHARSET)?tc:fc);
#else
			archive_set_error(a, ARCHIVE_ERRNO_MISC,
			    "A character-set conversion not fully supported "
			    "on this platform");
#endif
		}
		/* Failed; free a sconv object. */
		free_sconv_object(sc);
		return (NULL);
	}

	/*
	 * Success!
	 */
	if (a != NULL)
		add_sconv_object(a, sc);
	return (sc);
}